

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O2

bool mdns::sendData(int fd,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer __buf;
  ssize_t sVar1;
  undefined1 local_20 [4];
  undefined8 local_1c;
  char local_14 [4];
  
  local_14[0] = '\0';
  local_14[1] = '\0';
  local_14[2] = '\0';
  local_14[3] = '\0';
  local_1c._0_1_ = '\0';
  local_1c._1_1_ = '\0';
  local_1c._2_1_ = '\0';
  local_1c._3_1_ = '\0';
  local_1c._4_1_ = '\0';
  local_1c._5_1_ = '\0';
  local_1c._6_1_ = '\0';
  local_1c._7_1_ = '\0';
  local_20._0_2_ = 2;
  local_20[2] = '\x14';
  local_20[3] = -0x17;
  inet_aton("224.0.0.251",(in_addr *)&local_1c);
  __buf = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
  sVar1 = sendto(fd,__buf,(long)(data->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)__buf,0,
                 (sockaddr *)local_20,0x10);
  if (sVar1 < 0) {
    perror(" ! Failed to send request");
  }
  return -1 < sVar1;
}

Assistant:

bool sendData(const int fd, const std::vector<uint8_t> &data)
{
    sockaddr_in broadcastAddr{};
    broadcastAddr.sin_family = AF_INET;
    broadcastAddr.sin_port = htons(5353);
    inet_aton("224.0.0.251", &broadcastAddr.sin_addr);

    long st = sendto(
            fd,
            data.data(),
            data.size(),
            0,
            reinterpret_cast<const sockaddr*>(&broadcastAddr),
            sizeof(broadcastAddr));

    // todo check length
    if (st < 0) {
        perror(" ! Failed to send request");
        return false;
    }

    return true;
}